

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FreeZeroObjVariablePS::execute
          (FreeZeroObjVariablePS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  pointer pDVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  cpp_dec_float<200U,_int,_void> *pcVar7;
  int *piVar8;
  bool *pbVar9;
  fpclass_type *pfVar10;
  pointer pnVar11;
  int32_t iVar12;
  VarStatus VVar13;
  long lVar14;
  long lVar15;
  int32_t *piVar16;
  fpclass_type fVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  uint *puVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar22;
  uint *puVar23;
  cpp_dec_float<200U,_int,_void> *pcVar24;
  undefined4 *puVar25;
  uint *puVar26;
  cpp_dec_float<200U,_int,_void> *pcVar27;
  pointer pnVar28;
  pointer pnVar29;
  long lVar30;
  long lVar31;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar32;
  long in_FS_OFFSET;
  byte bVar33;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  slack;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  uint local_70c;
  undefined1 local_708 [16];
  undefined1 local_6f8 [16];
  undefined1 local_6e8 [16];
  undefined1 local_6d8 [16];
  undefined1 local_6c8 [16];
  undefined1 local_6b8 [16];
  undefined1 local_6a8 [13];
  undefined3 uStack_69b;
  int iStack_698;
  bool abStack_694 [4];
  fpclass_type local_690 [4];
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_680;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_678;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_670;
  long local_668;
  cpp_dec_float<200U,_int,_void> local_660;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_5e0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_5d8;
  undefined1 local_5b8 [32];
  undefined1 local_598 [16];
  undefined1 local_588 [16];
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  undefined1 local_558 [13];
  undefined3 uStack_54b;
  int iStack_548;
  bool bStack_544;
  undefined8 local_540;
  undefined1 local_538 [32];
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [13];
  undefined3 uStack_4cb;
  int iStack_4c8;
  bool bStack_4c4;
  undefined8 local_4c0;
  fpclass_type local_4b8;
  int32_t iStack_4b4;
  undefined8 uStack_4b0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4a8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4a0;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [13];
  undefined3 uStack_42b;
  undefined5 uStack_428;
  undefined8 local_420;
  cpp_dec_float<200U,_int,_void> local_410;
  cpp_dec_float<200U,_int,_void> local_390;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_310;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_290;
  cpp_dec_float<200U,_int,_void> local_210;
  cpp_dec_float<200U,_int,_void> local_190;
  uint local_110 [28];
  uint local_a0 [28];
  
  bVar33 = 0;
  iVar6 = this->m_j;
  iVar20 = this->m_old_j;
  if (iVar6 != iVar20) {
    pnVar11 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar23 = (uint *)(pnVar11 + iVar6);
    puVar21 = (uint *)(pnVar11 + iVar20);
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      *puVar21 = *puVar23;
      puVar23 = puVar23 + 1;
      puVar21 = puVar21 + 1;
    }
    pnVar11[iVar20].m_backend.exp = pnVar11[iVar6].m_backend.exp;
    pnVar11[iVar20].m_backend.neg = pnVar11[iVar6].m_backend.neg;
    iVar12 = pnVar11[iVar6].m_backend.prec_elem;
    pnVar11[iVar20].m_backend.fpclass = pnVar11[iVar6].m_backend.fpclass;
    pnVar11[iVar20].m_backend.prec_elem = iVar12;
    iVar6 = this->m_j;
    pnVar11 = (r->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar20 = this->m_old_j;
    puVar23 = (uint *)(pnVar11 + iVar6);
    puVar21 = (uint *)(pnVar11 + iVar20);
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      *puVar21 = *puVar23;
      puVar23 = puVar23 + 1;
      puVar21 = puVar21 + 1;
    }
    pnVar11[iVar20].m_backend.exp = pnVar11[iVar6].m_backend.exp;
    pnVar11[iVar20].m_backend.neg = pnVar11[iVar6].m_backend.neg;
    iVar12 = pnVar11[iVar6].m_backend.prec_elem;
    pnVar11[iVar20].m_backend.fpclass = pnVar11[iVar6].m_backend.fpclass;
    pnVar11[iVar20].m_backend.prec_elem = iVar12;
    cStatus->data[this->m_old_j] = cStatus->data[this->m_j];
  }
  iVar6 = (this->m_col).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused;
  if (0 < iVar6) {
    lVar14 = (long)(this->m_old_i -
                   (this->m_col).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused);
    lVar18 = lVar14 * 0x20 + 0x3e;
    lVar30 = 0x20;
    lVar31 = 0;
    do {
      uVar19 = (((this->m_col).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem)->val).m_backend.data._M_elems[lVar30];
      pnVar11 = (s->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar23 = (pnVar11->m_backend).data._M_elems + lVar18;
      puVar21 = (uint *)(pnVar11 + (int)uVar19);
      puVar26 = puVar23 + 0xffffffffffffffe2;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        *puVar26 = *puVar21;
        puVar21 = puVar21 + 1;
        puVar26 = puVar26 + 1;
      }
      puVar23[0xfffffffffffffffe] = pnVar11[(int)uVar19].m_backend.exp;
      *(bool *)(puVar23 + 0xffffffffffffffff) = pnVar11[(int)uVar19].m_backend.neg;
      iVar12 = pnVar11[(int)uVar19].m_backend.prec_elem;
      puVar23[0] = pnVar11[(int)uVar19].m_backend.fpclass;
      puVar23[1] = iVar12;
      pnVar11 = (y->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar23 = (pnVar11->m_backend).data._M_elems + lVar18 + -0x1e;
      puVar21 = (uint *)(pnVar11 + (int)uVar19);
      puVar26 = puVar23;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        *puVar26 = *puVar21;
        puVar21 = puVar21 + 1;
        puVar26 = puVar26 + 1;
      }
      puVar23[0x1c] = pnVar11[(int)uVar19].m_backend.exp;
      *(bool *)(puVar23 + 0x1d) = pnVar11[(int)uVar19].m_backend.neg;
      *(undefined8 *)(puVar23 + 0x1e) = *(undefined8 *)&pnVar11[(int)uVar19].m_backend.fpclass;
      rStatus->data[lVar14 + lVar31 + 1] = rStatus->data[(int)uVar19];
      lVar31 = lVar31 + 1;
      iVar6 = (this->m_col).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused;
      lVar30 = lVar30 + 0x21;
      lVar18 = lVar18 + 0x20;
    } while (lVar31 < iVar6);
  }
  local_5d8.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  local_5d8.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  local_5d8.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  local_5d8._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006b38e0;
  local_5d8.theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  iVar20 = 2;
  if (0 < iVar6) {
    iVar20 = iVar6;
  }
  local_680 = x;
  local_670 = cStatus;
  local_5e0 = r;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&local_5d8,iVar20);
  local_4a8 = s;
  local_4a0 = y;
  if (this->m_loFree == false) {
    ::soplex::infinity::__tls_init();
    local_4c0._0_4_ = cpp_dec_float_finite;
    local_4c0._4_4_ = 0x1c;
    local_538._0_16_ = (undefined1  [16])0x0;
    local_538._16_16_ = (undefined1  [16])0x0;
    local_518 = (undefined1  [16])0x0;
    local_508 = (undefined1  [16])0x0;
    local_4f8 = (undefined1  [16])0x0;
    local_4e8 = (undefined1  [16])0x0;
    local_4d8 = SUB1613((undefined1  [16])0x0,0);
    uStack_4cb = 0;
    iStack_4c8 = 0;
    bStack_4c4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_538,
               (double)(*(ulong *)(in_FS_OFFSET + -8) ^ (ulong)DAT_00601010));
    if ((int)((ulong)((long)(this->m_rows).data.
                            super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_rows).data.
                           super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5) < 1) {
      local_70c = 0xffffffff;
    }
    else {
      local_678 = &(this->m_lRhs).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      local_70c = 0xffffffff;
      lVar14 = 0;
      do {
        local_540._0_4_ = cpp_dec_float_finite;
        local_540._4_4_ = 0x1c;
        local_5b8._0_16_ = (undefined1  [16])0x0;
        local_5b8._16_16_ = (undefined1  [16])0x0;
        local_598 = (undefined1  [16])0x0;
        local_588 = (undefined1  [16])0x0;
        local_578 = (undefined1  [16])0x0;
        local_568 = (undefined1  [16])0x0;
        local_558 = SUB1613((undefined1  [16])0x0,0);
        uStack_54b = 0;
        iStack_548 = 0;
        bStack_544 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_5b8,0.0);
        pDVar1 = (this->m_rows).data.
                 super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar32 = &pDVar1[lVar14].
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ;
        if (0 < pDVar1[lVar14].
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused) {
          lVar18 = 0;
          lVar30 = 0;
          do {
            if (*(int *)((long)(&pSVar32->m_elem->val + 1) + lVar18) != this->m_j) {
              pNVar2 = pSVar32->m_elem;
              pcVar24 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)(pNVar2->val).m_backend.data._M_elems + lVar18);
              pcVar27 = &(local_680->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [*(int *)((long)(&pNVar2->val + 1) + lVar18)].m_backend;
              local_690[0] = cpp_dec_float_finite;
              local_690[1] = 0x1c;
              local_708 = (undefined1  [16])0x0;
              local_6f8 = (undefined1  [16])0x0;
              local_6e8 = (undefined1  [16])0x0;
              local_6d8 = (undefined1  [16])0x0;
              local_6c8 = (undefined1  [16])0x0;
              local_6b8 = (undefined1  [16])0x0;
              local_6a8 = SUB1613((undefined1  [16])0x0,0);
              uStack_69b = 0;
              iStack_698 = 0;
              abStack_694[0] = false;
              pcVar7 = pcVar24;
              if (((cpp_dec_float<200U,_int,_void> *)local_708 != pcVar27) &&
                 (pcVar7 = pcVar27, pcVar24 != (cpp_dec_float<200U,_int,_void> *)local_708)) {
                pcVar27 = (cpp_dec_float<200U,_int,_void> *)local_708;
                for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                  (pcVar27->data)._M_elems[0] = (pcVar24->data)._M_elems[0];
                  pcVar24 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar24 + (ulong)bVar33 * -8 + 4);
                  pcVar27 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar27 + (ulong)bVar33 * -8 + 4);
                }
                iStack_698 = *(int *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar18);
                abStack_694[0] = *(bool *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar18 + 4);
                local_690._0_8_ =
                     *(undefined8 *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar18 + 8);
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_708,pcVar7);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_5b8,
                         (cpp_dec_float<200U,_int,_void> *)local_708);
            }
            lVar30 = lVar30 + 1;
            lVar18 = lVar18 + 0x84;
          } while (lVar30 < pDVar1[lVar14].
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .memused);
        }
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[](&local_310,local_678,(int)lVar14);
        uVar4 = local_540;
        bVar3 = bStack_544;
        iVar6 = iStack_548;
        pnVar22 = &local_310;
        pcVar24 = (cpp_dec_float<200U,_int,_void> *)local_708;
        for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
          (pcVar24->data)._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
          pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar22 + ((ulong)bVar33 * -2 + 1) * 4);
          pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar33 * -8 + 4);
        }
        iStack_698 = local_310.m_backend.exp;
        abStack_694[0] = local_310.m_backend.neg;
        local_690[0] = local_310.m_backend.fpclass;
        local_690[1] = local_310.m_backend.prec_elem;
        fVar17 = local_310.m_backend.fpclass;
        if ((local_310.m_backend.neg == true) &&
           (local_708._0_4_ != 0 || fVar17 != cpp_dec_float_finite)) {
          abStack_694[0] = false;
        }
        puVar23 = (uint *)local_5b8;
        pcVar24 = &local_660;
        for (lVar18 = 0x1c; uVar5 = local_540, lVar18 != 0; lVar18 = lVar18 + -1) {
          (pcVar24->data)._M_elems[0] = *puVar23;
          puVar23 = puVar23 + (ulong)bVar33 * -2 + 1;
          pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar33 * -8 + 4);
        }
        local_660.exp = iVar6;
        local_660.neg = bVar3;
        local_540._0_4_ = (fpclass_type)uVar4;
        local_540._4_4_ = SUB84(uVar4,4);
        local_660.fpclass = (fpclass_type)local_540;
        local_660.prec_elem = local_540._4_4_;
        if ((bVar3 != false) &&
           (local_660.data._M_elems[0] != 0 || (fpclass_type)uVar4 != cpp_dec_float_finite)) {
          local_660.neg = (bool)(bVar3 ^ 1);
        }
        local_540 = uVar5;
        if ((fpclass_type)uVar4 == cpp_dec_float_NaN || fVar17 == cpp_dec_float_NaN) {
          bVar3 = false;
        }
        else {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_708,&local_660);
          bVar3 = 0 < iVar6;
        }
        pcVar24 = &local_660;
        if (bVar3) {
          pcVar24 = (cpp_dec_float<200U,_int,_void> *)local_708;
        }
        pcVar7 = &local_410;
        for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
          (pcVar7->data)._M_elems[0] = (pcVar24->data)._M_elems[0];
          pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar33 * -8 + 4);
          pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + ((ulong)bVar33 * -2 + 1) * 4);
        }
        piVar8 = &local_660.exp;
        if (bVar3) {
          piVar8 = &iStack_698;
        }
        local_410.exp = *piVar8;
        pbVar9 = &local_660.neg;
        if (bVar3) {
          pbVar9 = abStack_694;
        }
        local_410.neg = *pbVar9;
        pfVar10 = &local_660.fpclass;
        if (bVar3) {
          pfVar10 = local_690;
        }
        piVar16 = &local_660.prec_elem;
        if (bVar3) {
          piVar16 = (int32_t *)(local_690 + 1);
        }
        local_410.fpclass = *pfVar10;
        local_410.prec_elem = *piVar16;
        if (*pfVar10 != cpp_dec_float_NaN) {
          local_690[0] = cpp_dec_float_finite;
          local_690[1] = 0x1c;
          local_708 = (undefined1  [16])0x0;
          local_6f8 = (undefined1  [16])0x0;
          local_6e8 = (undefined1  [16])0x0;
          local_6d8 = (undefined1  [16])0x0;
          local_6c8 = (undefined1  [16])0x0;
          local_6b8 = (undefined1  [16])0x0;
          local_6a8 = SUB1613((undefined1  [16])0x0,0);
          uStack_69b = 0;
          iStack_698 = 0;
          abStack_694[0] = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_708,1.0);
          iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_410,(cpp_dec_float<200U,_int,_void> *)local_708);
          if (iVar6 < 0) {
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_410,1.0);
          }
        }
        local_668 = lVar14;
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_390,local_678,(int)lVar14);
        local_690[0] = cpp_dec_float_finite;
        local_690[1] = 0x1c;
        local_708 = (undefined1  [16])0x0;
        local_6f8 = (undefined1  [16])0x0;
        local_6e8 = (undefined1  [16])0x0;
        local_6d8 = (undefined1  [16])0x0;
        local_6c8 = (undefined1  [16])0x0;
        local_6b8 = (undefined1  [16])0x0;
        local_6a8 = SUB1613((undefined1  [16])0x0,0);
        uStack_69b = 0;
        iStack_698 = 0;
        abStack_694[0] = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_708,&local_390,&local_410);
        local_420._0_4_ = cpp_dec_float_finite;
        local_420._4_4_ = 0x1c;
        local_498 = (undefined1  [16])0x0;
        local_488 = (undefined1  [16])0x0;
        local_478 = (undefined1  [16])0x0;
        local_468 = (undefined1  [16])0x0;
        local_458 = (undefined1  [16])0x0;
        local_448 = (undefined1  [16])0x0;
        local_438 = SUB1613((undefined1  [16])0x0,0);
        uStack_42b = 0;
        uStack_428._0_4_ = 0;
        uStack_428._4_1_ = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_498,
                   (cpp_dec_float<200U,_int,_void> *)local_5b8,&local_410);
        local_660.fpclass = cpp_dec_float_finite;
        local_660.prec_elem = 0x1c;
        local_660.neg = false;
        local_660.exp = 0;
        pcVar24 = (cpp_dec_float<200U,_int,_void> *)local_708;
        pcVar7 = &local_660;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pcVar7->data)._M_elems[0] = (pcVar24->data)._M_elems[0];
          pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar33 * -8 + 4);
          pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar33 * -8 + 4);
        }
        local_660.exp = iStack_698;
        local_660.neg = abStack_694[0];
        local_660.fpclass = local_690[0];
        local_660.prec_elem = local_690[1];
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&local_660,(cpp_dec_float<200U,_int,_void> *)local_498);
        bVar3 = local_660.neg;
        iVar6 = local_660.exp;
        pcVar24 = &local_660;
        puVar23 = local_110;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          *puVar23 = (pcVar24->data)._M_elems[0];
          pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar33 * -8 + 4);
          puVar23 = puVar23 + (ulong)bVar33 * -2 + 1;
        }
        local_4b8 = local_660.fpclass;
        iStack_4b4 = local_660.prec_elem;
        uStack_4b0 = 0;
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_210,this);
        lVar14 = local_668;
        puVar23 = local_110;
        pcVar24 = (cpp_dec_float<200U,_int,_void> *)local_708;
        for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
          (pcVar24->data)._M_elems[0] = *puVar23;
          puVar23 = puVar23 + (ulong)bVar33 * -2 + 1;
          pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar33 * -8 + 4);
        }
        iStack_698 = iVar6;
        abStack_694[0] = bVar3;
        fVar17 = local_4b8;
        local_690[0] = local_4b8;
        local_690[1] = iStack_4b4;
        if ((bVar3 != false) && (local_708._0_4_ != 0 || fVar17 != cpp_dec_float_finite)) {
          abStack_694[0] = (bool)(bVar3 ^ 1);
        }
        if ((fVar17 != cpp_dec_float_NaN) && (local_210.fpclass != cpp_dec_float_NaN)) {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_708,&local_210);
          if (iVar6 < 1) {
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_660,0.0);
          }
        }
        local_390.fpclass = cpp_dec_float_finite;
        local_390.prec_elem = 0x1c;
        local_390.neg = false;
        local_390.exp = 0;
        pcVar24 = &local_660;
        pcVar7 = &local_390;
        for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
          (pcVar7->data)._M_elems[0] = (pcVar24->data)._M_elems[0];
          pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + ((ulong)bVar33 * -2 + 1) * 4)
          ;
          pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar33 * -8 + 4);
        }
        local_390.exp = local_660.exp;
        local_390.neg = local_660.neg;
        local_390.fpclass = local_660.fpclass;
        local_390.prec_elem = local_660.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&local_390,&local_410);
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_498,pSVar32,this->m_j);
        local_690[0] = cpp_dec_float_finite;
        local_690[1] = 0x1c;
        local_708 = (undefined1  [16])0x0;
        local_6f8 = (undefined1  [16])0x0;
        local_6e8 = (undefined1  [16])0x0;
        local_6d8 = (undefined1  [16])0x0;
        local_6c8 = (undefined1  [16])0x0;
        local_6b8 = (undefined1  [16])0x0;
        local_6a8 = SUB1613((undefined1  [16])0x0,0);
        uStack_69b = 0;
        iStack_698 = 0;
        abStack_694[0] = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_708,&local_390,
                   (cpp_dec_float<200U,_int,_void> *)local_498);
        uVar19 = (uint)lVar14;
        DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(&local_5d8,uVar19,
              (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_5b8);
        if (((local_690[0] != cpp_dec_float_NaN) && ((fpclass_type)local_4c0 != cpp_dec_float_NaN))
           && (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_708,
                                  (cpp_dec_float<200U,_int,_void> *)local_538), 0 < iVar6)) {
          pcVar24 = (cpp_dec_float<200U,_int,_void> *)local_708;
          puVar23 = (uint *)local_538;
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            *puVar23 = (pcVar24->data)._M_elems[0];
            pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar33 * -8 + 4);
            puVar23 = puVar23 + (ulong)bVar33 * -2 + 1;
          }
          iStack_4c8 = iStack_698;
          bStack_4c4 = abStack_694[0];
          local_4c0._0_4_ = local_690[0];
          local_4c0._4_4_ = local_690[1];
          local_70c = uVar19;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < (int)((ulong)((long)(this->m_rows).data.
                                            super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->m_rows).data.
                                           super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5));
    }
    if ((((this->m_bnd).m_backend.fpclass != cpp_dec_float_NaN) &&
        ((fpclass_type)local_4c0 != cpp_dec_float_NaN)) &&
       (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&(this->m_bnd).m_backend,(cpp_dec_float<200U,_int,_void> *)local_538),
       0 < iVar6)) goto LAB_00584c2d;
  }
  else {
    ::soplex::infinity::__tls_init();
    local_4c0._0_4_ = cpp_dec_float_finite;
    local_4c0._4_4_ = 0x1c;
    local_538._0_16_ = (undefined1  [16])0x0;
    local_538._16_16_ = (undefined1  [16])0x0;
    local_518 = (undefined1  [16])0x0;
    local_508 = (undefined1  [16])0x0;
    local_4f8 = (undefined1  [16])0x0;
    local_4e8 = (undefined1  [16])0x0;
    local_4d8 = SUB1613((undefined1  [16])0x0,0);
    uStack_4cb = 0;
    iStack_4c8 = 0;
    bStack_4c4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_538,*(double *)(in_FS_OFFSET + -8));
    if ((int)((ulong)((long)(this->m_rows).data.
                            super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_rows).data.
                           super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5) < 1) {
      local_70c = 0xffffffff;
    }
    else {
      local_678 = &(this->m_lRhs).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      local_70c = 0xffffffff;
      lVar14 = 0;
      do {
        local_540._0_4_ = cpp_dec_float_finite;
        local_540._4_4_ = 0x1c;
        local_5b8._0_16_ = (undefined1  [16])0x0;
        local_5b8._16_16_ = (undefined1  [16])0x0;
        local_598 = (undefined1  [16])0x0;
        local_588 = (undefined1  [16])0x0;
        local_578 = (undefined1  [16])0x0;
        local_568 = (undefined1  [16])0x0;
        local_558 = SUB1613((undefined1  [16])0x0,0);
        uStack_54b = 0;
        iStack_548 = 0;
        bStack_544 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_5b8,0.0);
        pDVar1 = (this->m_rows).data.
                 super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar32 = &pDVar1[lVar14].
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ;
        if (0 < pDVar1[lVar14].
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused) {
          lVar18 = 0;
          lVar30 = 0;
          do {
            if (*(int *)((long)(&pSVar32->m_elem->val + 1) + lVar18) != this->m_j) {
              pNVar2 = pSVar32->m_elem;
              pcVar24 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)(pNVar2->val).m_backend.data._M_elems + lVar18);
              pcVar27 = &(local_680->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [*(int *)((long)(&pNVar2->val + 1) + lVar18)].m_backend;
              local_690[0] = cpp_dec_float_finite;
              local_690[1] = 0x1c;
              local_708 = (undefined1  [16])0x0;
              local_6f8 = (undefined1  [16])0x0;
              local_6e8 = (undefined1  [16])0x0;
              local_6d8 = (undefined1  [16])0x0;
              local_6c8 = (undefined1  [16])0x0;
              local_6b8 = (undefined1  [16])0x0;
              local_6a8 = SUB1613((undefined1  [16])0x0,0);
              uStack_69b = 0;
              iStack_698 = 0;
              abStack_694[0] = false;
              pcVar7 = pcVar24;
              if (((cpp_dec_float<200U,_int,_void> *)local_708 != pcVar27) &&
                 (pcVar7 = pcVar27, pcVar24 != (cpp_dec_float<200U,_int,_void> *)local_708)) {
                pcVar27 = (cpp_dec_float<200U,_int,_void> *)local_708;
                for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                  (pcVar27->data)._M_elems[0] = (pcVar24->data)._M_elems[0];
                  pcVar24 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar24 + (ulong)bVar33 * -8 + 4);
                  pcVar27 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar27 + (ulong)bVar33 * -8 + 4);
                }
                iStack_698 = *(int *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar18);
                abStack_694[0] = *(bool *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar18 + 4);
                local_690._0_8_ =
                     *(undefined8 *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar18 + 8);
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_708,pcVar7);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_5b8,
                         (cpp_dec_float<200U,_int,_void> *)local_708);
            }
            lVar30 = lVar30 + 1;
            lVar18 = lVar18 + 0x84;
          } while (lVar30 < pDVar1[lVar14].
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .memused);
        }
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[](&local_290,local_678,(int)lVar14);
        uVar4 = local_540;
        bVar3 = bStack_544;
        iVar6 = iStack_548;
        pnVar22 = &local_290;
        pcVar24 = (cpp_dec_float<200U,_int,_void> *)local_708;
        for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
          (pcVar24->data)._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
          pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar22 + ((ulong)bVar33 * -2 + 1) * 4);
          pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar33 * -8 + 4);
        }
        iStack_698 = local_290.m_backend.exp;
        abStack_694[0] = local_290.m_backend.neg;
        local_690[0] = local_290.m_backend.fpclass;
        local_690[1] = local_290.m_backend.prec_elem;
        fVar17 = local_290.m_backend.fpclass;
        if ((local_290.m_backend.neg == true) &&
           (local_708._0_4_ != 0 || fVar17 != cpp_dec_float_finite)) {
          abStack_694[0] = false;
        }
        puVar23 = (uint *)local_5b8;
        pcVar24 = &local_660;
        for (lVar18 = 0x1c; uVar5 = local_540, lVar18 != 0; lVar18 = lVar18 + -1) {
          (pcVar24->data)._M_elems[0] = *puVar23;
          puVar23 = puVar23 + (ulong)bVar33 * -2 + 1;
          pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar33 * -8 + 4);
        }
        local_660.exp = iVar6;
        local_660.neg = bVar3;
        local_540._0_4_ = (fpclass_type)uVar4;
        local_540._4_4_ = SUB84(uVar4,4);
        local_660.fpclass = (fpclass_type)local_540;
        local_660.prec_elem = local_540._4_4_;
        if ((bVar3 != false) &&
           (local_660.data._M_elems[0] != 0 || (fpclass_type)uVar4 != cpp_dec_float_finite)) {
          local_660.neg = (bool)(bVar3 ^ 1);
        }
        local_540 = uVar5;
        if ((fpclass_type)uVar4 == cpp_dec_float_NaN || fVar17 == cpp_dec_float_NaN) {
          bVar3 = false;
        }
        else {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_708,&local_660);
          bVar3 = 0 < iVar6;
        }
        pcVar24 = &local_660;
        if (bVar3) {
          pcVar24 = (cpp_dec_float<200U,_int,_void> *)local_708;
        }
        pcVar7 = &local_410;
        for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
          (pcVar7->data)._M_elems[0] = (pcVar24->data)._M_elems[0];
          pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar33 * -8 + 4);
          pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + ((ulong)bVar33 * -2 + 1) * 4);
        }
        piVar8 = &local_660.exp;
        if (bVar3) {
          piVar8 = &iStack_698;
        }
        local_410.exp = *piVar8;
        pbVar9 = &local_660.neg;
        if (bVar3) {
          pbVar9 = abStack_694;
        }
        local_410.neg = *pbVar9;
        pfVar10 = &local_660.fpclass;
        if (bVar3) {
          pfVar10 = local_690;
        }
        piVar16 = &local_660.prec_elem;
        if (bVar3) {
          piVar16 = (int32_t *)(local_690 + 1);
        }
        local_410.fpclass = *pfVar10;
        local_410.prec_elem = *piVar16;
        if (*pfVar10 != cpp_dec_float_NaN) {
          local_690[0] = cpp_dec_float_finite;
          local_690[1] = 0x1c;
          local_708 = (undefined1  [16])0x0;
          local_6f8 = (undefined1  [16])0x0;
          local_6e8 = (undefined1  [16])0x0;
          local_6d8 = (undefined1  [16])0x0;
          local_6c8 = (undefined1  [16])0x0;
          local_6b8 = (undefined1  [16])0x0;
          local_6a8 = SUB1613((undefined1  [16])0x0,0);
          uStack_69b = 0;
          iStack_698 = 0;
          abStack_694[0] = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_708,1.0);
          iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_410,(cpp_dec_float<200U,_int,_void> *)local_708);
          if (iVar6 < 0) {
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_410,1.0);
          }
        }
        local_668 = lVar14;
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_390,local_678,(int)lVar14);
        local_690[0] = cpp_dec_float_finite;
        local_690[1] = 0x1c;
        local_708 = (undefined1  [16])0x0;
        local_6f8 = (undefined1  [16])0x0;
        local_6e8 = (undefined1  [16])0x0;
        local_6d8 = (undefined1  [16])0x0;
        local_6c8 = (undefined1  [16])0x0;
        local_6b8 = (undefined1  [16])0x0;
        local_6a8 = SUB1613((undefined1  [16])0x0,0);
        uStack_69b = 0;
        iStack_698 = 0;
        abStack_694[0] = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_708,&local_390,&local_410);
        local_420._0_4_ = cpp_dec_float_finite;
        local_420._4_4_ = 0x1c;
        local_498 = (undefined1  [16])0x0;
        local_488 = (undefined1  [16])0x0;
        local_478 = (undefined1  [16])0x0;
        local_468 = (undefined1  [16])0x0;
        local_458 = (undefined1  [16])0x0;
        local_448 = (undefined1  [16])0x0;
        local_438 = SUB1613((undefined1  [16])0x0,0);
        uStack_42b = 0;
        uStack_428._0_4_ = 0;
        uStack_428._4_1_ = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_498,
                   (cpp_dec_float<200U,_int,_void> *)local_5b8,&local_410);
        local_660.fpclass = cpp_dec_float_finite;
        local_660.prec_elem = 0x1c;
        local_660.neg = false;
        local_660.exp = 0;
        pcVar24 = (cpp_dec_float<200U,_int,_void> *)local_708;
        pcVar7 = &local_660;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pcVar7->data)._M_elems[0] = (pcVar24->data)._M_elems[0];
          pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar33 * -8 + 4);
          pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar33 * -8 + 4);
        }
        local_660.exp = iStack_698;
        local_660.neg = abStack_694[0];
        local_660.fpclass = local_690[0];
        local_660.prec_elem = local_690[1];
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&local_660,(cpp_dec_float<200U,_int,_void> *)local_498);
        bVar3 = local_660.neg;
        iVar6 = local_660.exp;
        pcVar24 = &local_660;
        puVar23 = local_a0;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          *puVar23 = (pcVar24->data)._M_elems[0];
          pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar33 * -8 + 4);
          puVar23 = puVar23 + (ulong)bVar33 * -2 + 1;
        }
        local_4b8 = local_660.fpclass;
        iStack_4b4 = local_660.prec_elem;
        uStack_4b0 = 0;
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_190,this);
        lVar14 = local_668;
        puVar23 = local_a0;
        pcVar24 = (cpp_dec_float<200U,_int,_void> *)local_708;
        for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
          (pcVar24->data)._M_elems[0] = *puVar23;
          puVar23 = puVar23 + (ulong)bVar33 * -2 + 1;
          pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar33 * -8 + 4);
        }
        iStack_698 = iVar6;
        abStack_694[0] = bVar3;
        fVar17 = local_4b8;
        local_690[0] = local_4b8;
        local_690[1] = iStack_4b4;
        if ((bVar3 != false) && (local_708._0_4_ != 0 || fVar17 != cpp_dec_float_finite)) {
          abStack_694[0] = (bool)(bVar3 ^ 1);
        }
        if ((fVar17 != cpp_dec_float_NaN) && (local_190.fpclass != cpp_dec_float_NaN)) {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_708,&local_190);
          if (iVar6 < 1) {
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_660,0.0);
          }
        }
        local_390.fpclass = cpp_dec_float_finite;
        local_390.prec_elem = 0x1c;
        local_390.neg = false;
        local_390.exp = 0;
        pcVar24 = &local_660;
        pcVar7 = &local_390;
        for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
          (pcVar7->data)._M_elems[0] = (pcVar24->data)._M_elems[0];
          pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + ((ulong)bVar33 * -2 + 1) * 4)
          ;
          pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar33 * -8 + 4);
        }
        local_390.exp = local_660.exp;
        local_390.neg = local_660.neg;
        local_390.fpclass = local_660.fpclass;
        local_390.prec_elem = local_660.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&local_390,&local_410);
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_498,pSVar32,this->m_j);
        local_690[0] = cpp_dec_float_finite;
        local_690[1] = 0x1c;
        local_708 = (undefined1  [16])0x0;
        local_6f8 = (undefined1  [16])0x0;
        local_6e8 = (undefined1  [16])0x0;
        local_6d8 = (undefined1  [16])0x0;
        local_6c8 = (undefined1  [16])0x0;
        local_6b8 = (undefined1  [16])0x0;
        local_6a8 = SUB1613((undefined1  [16])0x0,0);
        uStack_69b = 0;
        iStack_698 = 0;
        abStack_694[0] = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_708,&local_390,
                   (cpp_dec_float<200U,_int,_void> *)local_498);
        uVar19 = (uint)lVar14;
        DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(&local_5d8,uVar19,
              (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_5b8);
        if (((local_690[0] != cpp_dec_float_NaN) && ((fpclass_type)local_4c0 != cpp_dec_float_NaN))
           && (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_708,
                                  (cpp_dec_float<200U,_int,_void> *)local_538), iVar6 < 0)) {
          pcVar24 = (cpp_dec_float<200U,_int,_void> *)local_708;
          puVar23 = (uint *)local_538;
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            *puVar23 = (pcVar24->data)._M_elems[0];
            pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar33 * -8 + 4);
            puVar23 = puVar23 + (ulong)bVar33 * -2 + 1;
          }
          iStack_4c8 = iStack_698;
          bStack_4c4 = abStack_694[0];
          local_4c0._0_4_ = local_690[0];
          local_4c0._4_4_ = local_690[1];
          local_70c = uVar19;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < (int)((ulong)((long)(this->m_rows).data.
                                            super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->m_rows).data.
                                           super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5));
    }
    if ((((this->m_bnd).m_backend.fpclass != cpp_dec_float_NaN) &&
        ((fpclass_type)local_4c0 != cpp_dec_float_NaN)) &&
       (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&(this->m_bnd).m_backend,(cpp_dec_float<200U,_int,_void> *)local_538),
       iVar6 < 0)) {
LAB_00584c2d:
      iVar6 = this->m_j;
      pnVar29 = (local_680->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar11 = pnVar29 + iVar6;
      pnVar22 = &this->m_bnd;
      pnVar28 = pnVar11;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pnVar28->m_backend).data._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
        pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar22 + (ulong)bVar33 * -8 + 4);
        pnVar28 = (pointer)((long)pnVar28 + ((ulong)bVar33 * -2 + 1) * 4);
      }
      pnVar29[iVar6].m_backend.exp = (this->m_bnd).m_backend.exp;
      pnVar29[iVar6].m_backend.neg = (this->m_bnd).m_backend.neg;
      pnVar29[iVar6].m_backend.fpclass = (this->m_bnd).m_backend.fpclass;
      local_70c = 0xffffffff;
      iVar12 = (this->m_bnd).m_backend.prec_elem;
      goto LAB_00584ccd;
    }
  }
  iVar6 = this->m_j;
  pnVar29 = (local_680->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pnVar11 = pnVar29 + iVar6;
  puVar25 = (undefined4 *)local_538;
  pnVar28 = pnVar11;
  for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
    (pnVar28->m_backend).data._M_elems[0] = *puVar25;
    puVar25 = puVar25 + (ulong)bVar33 * -2 + 1;
    pnVar28 = (pointer)((long)pnVar28 + ((ulong)bVar33 * -2 + 1) * 4);
  }
  pnVar29[iVar6].m_backend.exp = iStack_4c8;
  pnVar29[iVar6].m_backend.neg = bStack_4c4;
  pnVar29[iVar6].m_backend.fpclass = (fpclass_type)local_4c0;
  iVar12 = local_4c0._4_4_;
LAB_00584ccd:
  (pnVar11->m_backend).prec_elem = iVar12;
  if (0 < (this->m_col).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar18 = 0;
    lVar14 = 0;
    do {
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_660,
                   &local_5d8.
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,(int)lVar14);
      pNVar2 = (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      pcVar24 = (cpp_dec_float<200U,_int,_void> *)
                ((long)(pNVar2->val).m_backend.data._M_elems + lVar18);
      pcVar27 = &(local_680->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend;
      local_4c0._0_4_ = cpp_dec_float_finite;
      local_4c0._4_4_ = 0x1c;
      local_538._0_16_ = (undefined1  [16])0x0;
      local_538._16_16_ = (undefined1  [16])0x0;
      local_518 = (undefined1  [16])0x0;
      local_508 = (undefined1  [16])0x0;
      local_4f8 = (undefined1  [16])0x0;
      local_4e8 = (undefined1  [16])0x0;
      local_4d8 = SUB1613((undefined1  [16])0x0,0);
      uStack_4cb = 0;
      iStack_4c8 = 0;
      bStack_4c4 = false;
      pcVar7 = pcVar24;
      if (((cpp_dec_float<200U,_int,_void> *)local_538 != pcVar27) &&
         (pcVar7 = pcVar27, pcVar24 != (cpp_dec_float<200U,_int,_void> *)local_538)) {
        pcVar27 = (cpp_dec_float<200U,_int,_void> *)local_538;
        for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
          (pcVar27->data)._M_elems[0] = (pcVar24->data)._M_elems[0];
          pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar33 * -8 + 4);
          pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar33 * -8 + 4);
        }
        iStack_4c8 = *(int *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar18);
        bStack_4c4 = *(bool *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar18 + 4);
        local_4c0 = *(undefined8 *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar18 + 8);
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                ((cpp_dec_float<200U,_int,_void> *)local_538,pcVar7);
      local_690[0] = cpp_dec_float_finite;
      local_690[1] = 0x1c;
      abStack_694[0] = false;
      iStack_698 = 0;
      pcVar24 = &local_660;
      pcVar7 = (cpp_dec_float<200U,_int,_void> *)local_708;
      for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
        (pcVar7->data)._M_elems[0] =
             (((cpp_dec_float<200U,_int,_void> *)&pcVar24->data)->data)._M_elems[0];
        pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + ((ulong)bVar33 * -2 + 1) * 4);
        pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar33 * -8 + 4);
      }
      iStack_698 = local_660.exp;
      abStack_694[0] = local_660.neg;
      local_690[0] = local_660.fpclass;
      local_690[1] = local_660.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                ((cpp_dec_float<200U,_int,_void> *)local_708,
                 (cpp_dec_float<200U,_int,_void> *)local_538);
      iVar6 = *(int *)((long)(&((this->m_col).
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .m_elem)->val + 1) + lVar18);
      pnVar11 = (local_4a8->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar24 = (cpp_dec_float<200U,_int,_void> *)local_708;
      pnVar29 = pnVar11 + iVar6;
      for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
        (pnVar29->m_backend).data._M_elems[0] = (pcVar24->data)._M_elems[0];
        pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar33 * -8 + 4);
        pnVar29 = (pointer)((long)pnVar29 + ((ulong)bVar33 * -2 + 1) * 4);
      }
      pnVar11[iVar6].m_backend.exp = iStack_698;
      pnVar11[iVar6].m_backend.neg = abStack_694[0];
      pnVar11[iVar6].m_backend.fpclass = local_690[0];
      pnVar11[iVar6].m_backend.prec_elem = local_690[1];
      lVar14 = lVar14 + 1;
      lVar18 = lVar18 + 0x84;
    } while (lVar14 < (this->m_col).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)
             ((local_5e0->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
  if (0 < (this->m_col).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar14 = 0x80;
    lVar18 = 0;
    do {
      iVar6 = *(int *)((long)(((this->m_col).
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .m_elem)->val).m_backend.data._M_elems + lVar14);
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_708,
                   &(this->m_rowObj).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,iVar6);
      pnVar11 = (local_4a0->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_708;
      pnVar29 = pnVar11 + iVar6;
      for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
        (pnVar29->m_backend).data._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
        pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar22 + ((ulong)bVar33 * -2 + 1) * 4);
        pnVar29 = (pointer)((long)pnVar29 + ((ulong)bVar33 * -2 + 1) * 4);
      }
      pnVar11[iVar6].m_backend.exp = iStack_698;
      pnVar11[iVar6].m_backend.neg = abStack_694[0];
      pnVar11[iVar6].m_backend.fpclass = local_690[0];
      pnVar11[iVar6].m_backend.prec_elem = local_690[1];
      lVar18 = lVar18 + 1;
      lVar14 = lVar14 + 0x84;
    } while (lVar18 < (this->m_col).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  if (0 < (this->m_col).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar18 = 0;
    lVar14 = 0;
    do {
      VVar13 = BASIC;
      if ((ulong)local_70c * 0x84 == lVar18) {
        local_670->data[this->m_j] = BASIC;
        pNVar2 = (this->m_col).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        iVar6 = *(int *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar18 + 8);
        pcVar24 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)(pNVar2->val).m_backend.data._M_elems + lVar18);
        if (this->m_loFree == true) {
          VVar13 = ON_LOWER;
          if (iVar6 != 2) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_708,0,(type *)0x0);
            iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (pcVar24,(cpp_dec_float<200U,_int,_void> *)local_708);
            VVar13 = (VarStatus)(iVar6 < 1);
          }
        }
        else {
          VVar13 = ON_UPPER;
          if (iVar6 != 2) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_708,0,(type *)0x0);
            iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (pcVar24,(cpp_dec_float<200U,_int,_void> *)local_708);
            VVar13 = (VarStatus)(0 < iVar6);
          }
        }
      }
      rStatus->data
      [*(int *)((long)(&((this->m_col).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .m_elem)->val + 1) + lVar18)] = VVar13;
      lVar14 = lVar14 + 1;
      lVar18 = lVar18 + 0x84;
    } while (lVar14 < (this->m_col).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  if (local_70c == 0xffffffff) {
    local_670->data[this->m_j] = this->m_loFree ^ ON_LOWER;
  }
  local_5d8._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006b38e0;
  if (local_5d8.theelem !=
      (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    free(local_5d8.theelem);
  }
  return;
}

Assistant:

void SPxMainSM<R>::FreeZeroObjVariablePS::execute(VectorBase<R>& x, VectorBase<R>& y,
      VectorBase<R>& s, VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the column and corresponding rows:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   int rIdx = m_old_i - m_col.size() + 1;

   for(int k = 0; k < m_col.size(); ++k)
   {
      int rIdx_new = m_col.index(k);
      s[rIdx] = s[rIdx_new];
      y[rIdx] = y[rIdx_new];
      rStatus[rIdx] = rStatus[rIdx_new];
      rIdx++;
   }

   // primal:
   int      domIdx = -1;
   DSVectorBase<R> slack(m_col.size());

   if(m_loFree)
   {
      R minRowUp = R(infinity);

      for(int k = 0; k < m_rows.size(); ++k)
      {
         R           val = 0.0;
         const SVectorBase<R>& row = m_rows[k];

         for(int l = 0; l < row.size(); ++l)
         {
            if(row.index(l) != m_j)
               val += row.value(l) * x[row.index(l)];
         }

         R scale = maxAbs(m_lRhs[k], val);

         if(scale < 1.0)
            scale = 1.0;

         R z = (m_lRhs[k] / scale) - (val / scale);

         if(isZero(z, this->epsilon()))
            z = 0.0;

         R up = z * scale / row[m_j];
         slack.add(k, val);

         if(up < minRowUp)
         {
            minRowUp = up;
            domIdx   = k;
         }
      }

      if(m_bnd < minRowUp)
      {
         x[m_j] = m_bnd;
         domIdx = -1;
      }
      else
         x[m_j] = minRowUp;
   }
   else
   {
      R maxRowLo = R(-infinity);

      for(int k = 0; k < m_rows.size(); ++k)
      {
         R val = 0.0;
         const SVectorBase<R>& row = m_rows[k];

         for(int l = 0; l < row.size(); ++l)
         {
            if(row.index(l) != m_j)
               val += row.value(l) * x[row.index(l)];
         }

         R scale = maxAbs(m_lRhs[k], val);

         if(scale < 1.0)
            scale = 1.0;

         R z = (m_lRhs[k] / scale) - (val / scale);

         if(isZero(z, this->epsilon()))
            z = 0.0;

         R lo = z * scale / row[m_j];
         slack.add(k, val);

         if(lo > maxRowLo)
         {
            maxRowLo = lo;
            domIdx   = k;
         }
      }

      if(m_bnd > maxRowLo)
      {
         x[m_j] = m_bnd;
         domIdx = -1;
      }
      else
         x[m_j] = maxRowLo;
   }

   for(int k = 0; k < m_col.size(); ++k)
      s[m_col.index(k)] = slack[k] + m_col.value(k) * x[m_j];

   // dual:
   r[m_j] = 0.0;

   for(int k = 0; k < m_col.size(); ++k)
   {
      int idx = m_col.index(k);
      y[idx] = m_rowObj[idx];
   }

   // basis:
   for(int k = 0; k < m_col.size(); ++k)
   {
      if(k != domIdx)
         rStatus[m_col.index(k)] = SPxSolverBase<R>::BASIC;

      else
      {
         cStatus[m_j] = SPxSolverBase<R>::BASIC;

         if(m_loFree)
            rStatus[m_col.index(k)] = (m_col.value(k) > 0) ? SPxSolverBase<R>::ON_UPPER :
                                      SPxSolverBase<R>::ON_LOWER;
         else
            rStatus[m_col.index(k)] = (m_col.value(k) > 0) ? SPxSolverBase<R>::ON_LOWER :
                                      SPxSolverBase<R>::ON_UPPER;
      }
   }

   if(domIdx == -1)
   {
      if(m_loFree)
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM20 Dimension doesn't match after this step.");
   }

#endif
}